

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O0

ptr<resp_msg> __thiscall nuraft::FakeNetwork::gotMsg(FakeNetwork *this,ptr<req_msg> *msg)

{
  element_type *srv;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar1;
  ptr<resp_msg> *resp;
  element_type *req;
  
  req = in_RDI;
  srv = std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x50))
  ;
  std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)req);
  raft_server::req_ext_params::req_ext_params((req_ext_params *)req);
  raft_server_handler::process_req(srv,(req_msg *)req,(req_ext_params *)in_RDI);
  raft_server::req_ext_params::~req_ext_params((req_ext_params *)0x13fab0);
  pVar1.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar1.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> FakeNetwork::gotMsg(ptr<req_msg>& msg) {
    ptr<resp_msg> resp = raft_server_handler::process_req(handler.get(), *msg);
    return resp;
}